

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int unqliteInitVm(unqlite *pDb,jx9_vm *pJx9Vm,unqlite_vm **ppOut)

{
  unqlite_vm *puVar1;
  unqlite_vm *pChunk;
  ulong uVar2;
  unqlite_col **ppuVar3;
  int iVar4;
  SyMemBackend *pBackend;
  long lVar5;
  
  *ppOut = (unqlite_vm *)0x0;
  pChunk = (unqlite_vm *)SyMemBackendPoolAlloc(&pDb->sMem,0xf8);
  iVar4 = -1;
  if (pChunk != (unqlite_vm *)0x0) {
    uVar2 = 0xfffffffffffffffc;
    do {
      *(undefined4 *)((long)(pChunk->sAlloc).apPool + (uVar2 - 0x44)) = 0;
      uVar2 = uVar2 + 4;
    } while (uVar2 < 0xf4);
    pBackend = &pChunk->sAlloc;
    SyMemBackendInitFromParent(pBackend,&pDb->sMem);
    ppuVar3 = (unqlite_col **)SyMemBackendAlloc(pBackend,0x100);
    pChunk->apCol = ppuVar3;
    if (ppuVar3 == (unqlite_col **)0x0) {
      SyMemBackendRelease(pBackend);
      SyMemBackendPoolFree(&pDb->sMem,pChunk);
    }
    else {
      pChunk->iColSize = 0x20;
      uVar2 = 0xfffffffffffffffc;
      do {
        *(undefined4 *)((long)ppuVar3 + uVar2 + 4) = 0;
        uVar2 = uVar2 + 4;
      } while (uVar2 < 0xfc);
      pChunk->pJx9Vm = pJx9Vm;
      pChunk->pDb = pDb;
      puVar1 = pDb->pVms;
      if (puVar1 != (unqlite_vm *)0x0) {
        pChunk->pNext = puVar1;
        puVar1->pPrev = pChunk;
      }
      pDb->pVms = pChunk;
      pDb->iVm = pDb->iVm + 1;
      lVar5 = 8;
      do {
        jx9_create_function(pChunk->pJx9Vm,
                            *(char **)(unqliteExportDiskKvStorage_sDiskStore + lVar5 + 0xb0),
                            *(_func_int_jx9_context_ptr_int_jx9_value_ptr_ptr **)
                             ((long)&unqliteRegisterJx9Functions_aBuiltin + lVar5),pChunk);
        lVar5 = lVar5 + 0x10;
      } while (lVar5 != 0x1f8);
      pChunk->nMagic = 0xea12cd72;
      *ppOut = pChunk;
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

static int unqliteInitVm(unqlite *pDb,jx9_vm *pJx9Vm,unqlite_vm **ppOut)
{
	unqlite_vm *pVm;

	*ppOut = 0;
	/* Allocate a new VM instance */
	pVm = (unqlite_vm *)SyMemBackendPoolAlloc(&pDb->sMem,sizeof(unqlite_vm));
	if( pVm == 0 ){
		return UNQLITE_NOMEM;
	}
	/* Zero the structure */
	SyZero(pVm,sizeof(unqlite_vm));
	/* Initialize */
	SyMemBackendInitFromParent(&pVm->sAlloc,&pDb->sMem);
	/* Allocate a new collection table */
	pVm->apCol = (unqlite_col **)SyMemBackendAlloc(&pVm->sAlloc,32 * sizeof(unqlite_col *)); 
	if( pVm->apCol == 0 ){
		goto fail;
	}
	pVm->iColSize = 32; /* Must be a power of two */
	/* Zero the table */
	SyZero((void *)pVm->apCol,pVm->iColSize * sizeof(unqlite_col *));
#if defined(UNQLITE_ENABLE_THREADS)
	if( sUnqlMPGlobal.nThreadingLevel > UNQLITE_THREAD_LEVEL_SINGLE ){
		 /* Associate a recursive mutex with this instance */
		 pVm->pMutex = SyMutexNew(sUnqlMPGlobal.pMutexMethods, SXMUTEX_TYPE_RECURSIVE);
		 if( pVm->pMutex == 0 ){
			 goto fail;
		 }
	 }
#endif
	/* Link the VM to the list of active virtual machines */
	pVm->pJx9Vm = pJx9Vm;
	pVm->pDb = pDb;
	MACRO_LD_PUSH(pDb->pVms,pVm);
	pDb->iVm++;
	/* Register Jx9 functions */
	unqliteRegisterJx9Functions(pVm);
	/* Set the magic number */
	pVm->nMagic = JX9_VM_INIT; /* Same magic number as Jx9 */
	/* All done */
	*ppOut = pVm;
	return UNQLITE_OK;
fail:
	SyMemBackendRelease(&pVm->sAlloc);
	SyMemBackendPoolFree(&pDb->sMem,pVm);
	return UNQLITE_NOMEM;
}